

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port_signature_map.c
# Opt level: O0

apx_error_t
apx_portSignatureMap_remove
          (apx_portSignatureMap_t *self,char *port_signature,apx_portInstance_t *port_instance)

{
  apx_portType_t aVar1;
  _Bool _Var2;
  size_t sVar3;
  apx_portSignatureMapEntry_t *self_00;
  apx_portSignatureMapEntry_t *entry;
  apx_error_t retval;
  apx_portInstance_t *port_instance_local;
  char *port_signature_local;
  apx_portSignatureMap_t *self_local;
  
  if (self == (apx_portSignatureMap_t *)0x0) {
    __assert_fail("self != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/port_signature_map.c"
                  ,0x121,
                  "apx_error_t apx_portSignatureMap_remove(apx_portSignatureMap_t *, const char *, apx_portInstance_t *)"
                 );
  }
  if (port_signature == (char *)0x0) {
    __assert_fail("port_signature != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/port_signature_map.c"
                  ,0x122,
                  "apx_error_t apx_portSignatureMap_remove(apx_portSignatureMap_t *, const char *, apx_portInstance_t *)"
                 );
  }
  sVar3 = strlen(port_signature);
  if (sVar3 == 0) {
    __assert_fail("strlen(port_signature) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/port_signature_map.c"
                  ,0x123,
                  "apx_error_t apx_portSignatureMap_remove(apx_portSignatureMap_t *, const char *, apx_portInstance_t *)"
                 );
  }
  if (port_instance == (apx_portInstance_t *)0x0) {
    __assert_fail("port_instance != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/port_signature_map.c"
                  ,0x124,
                  "apx_error_t apx_portSignatureMap_remove(apx_portSignatureMap_t *, const char *, apx_portInstance_t *)"
                 );
  }
  self_00 = apx_portSignatureMap_find(self,port_signature);
  if (self_00 == (apx_portSignatureMapEntry_t *)0x0) {
    entry._4_4_ = 0xc;
  }
  else {
    aVar1 = apx_portInstance_port_type(port_instance);
    if (aVar1 == '\x01') {
      apx_portSignatureMapEntry_detach_provide_port(self_00,port_instance);
      entry._4_4_ = apx_portSignatureMapEntry_notify_require_ports_about_provide_port_change
                              (self_00,port_instance,'\x01');
    }
    else {
      apx_portSignatureMapEntry_detach_require_port(self_00,port_instance);
      entry._4_4_ = apx_portSignatureMapEntry_notify_provide_ports_about_require_port_change
                              (self_00,port_instance,'\x01');
    }
    _Var2 = apx_portSignatureMapEntry_is_empty(self_00);
    if (_Var2) {
      apx_portSignatureMap_delete_entry(self,port_signature);
    }
  }
  return entry._4_4_;
}

Assistant:

static apx_error_t apx_portSignatureMap_remove(apx_portSignatureMap_t* self, const char* port_signature, apx_portInstance_t* port_instance)
{
   apx_error_t retval = APX_NO_ERROR;
   apx_portSignatureMapEntry_t *entry;
   assert(self != NULL);
   assert(port_signature != NULL);
   assert(strlen(port_signature) > 0);
   assert(port_instance != NULL);
   entry = apx_portSignatureMap_find(self, port_signature);
   if (entry == NULL)
   {
      retval = APX_NOT_FOUND_ERROR;
   }
   else
   {
      if (apx_portInstance_port_type(port_instance) == APX_PROVIDE_PORT)
      {
         apx_portSignatureMapEntry_detach_provide_port(entry, port_instance);
         retval = apx_portSignatureMapEntry_notify_require_ports_about_provide_port_change(entry, port_instance, APX_PORT_DISCONNECTED_EVENT);
      }
      else
      {
         apx_portSignatureMapEntry_detach_require_port(entry, port_instance);
         retval = apx_portSignatureMapEntry_notify_provide_ports_about_require_port_change(entry, port_instance, APX_PORT_DISCONNECTED_EVENT);
      }
      if (apx_portSignatureMapEntry_is_empty(entry))
      {
         apx_portSignatureMap_delete_entry(self, port_signature);
      }
   }
   return retval;
}